

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

bool operator<(wchar_t *lhs,ON_wString *rhs)

{
  int iVar1;
  wchar_t *string2;
  int rc;
  ON_wString *rhs_local;
  wchar_t *lhs_local;
  
  string2 = ON_wString::operator_cast_to_wchar_t_(rhs);
  iVar1 = ON_wString::Length(rhs);
  iVar1 = ON_wString::CompareOrdinal(lhs,-1,string2,iVar1,false);
  return iVar1 < 0;
}

Assistant:

bool operator<( const wchar_t* lhs, const ON_wString& rhs )
{
  const int rc = ON_wString::CompareOrdinal(
    lhs,
    -1,
    static_cast<const wchar_t*>(rhs),
    rhs.Length(),
    false
    );
  return (rc < 0);
}